

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODUPCEANCommon.h
# Opt level: O3

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
ZXing::OneD::UPCEANCommon::ConvertUPCEtoUPCA<std::__cxx11::wstring>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,UPCEANCommon *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *upce)

{
  int iVar1;
  ulong uVar2;
  wchar_t wVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> upceChars;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  uVar2 = *(ulong *)(this + 8);
  if (uVar2 < 7) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)__return_storage_ptr__,*(long *)this,*(long *)this + uVar2 * 4);
    return __return_storage_ptr__;
  }
  std::__cxx11::wstring::substr((ulong)local_48,(ulong)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  wVar3 = (wchar_t)__return_storage_ptr__;
  std::__cxx11::wstring::push_back(wVar3);
  iVar1 = *(int *)((long)local_48[0] + 0x14);
  if (iVar1 - 0x30U < 3) {
    std::__cxx11::wstring::substr((ulong)local_68,(ulong)local_48);
    std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,(ulong)local_68[0]);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] * 4 + 4);
    }
    std::__cxx11::wstring::push_back(wVar3);
    local_68[0] = local_58;
    std::__cxx11::wstring::_M_construct((ulong)local_68,L'\x04');
    std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,(ulong)local_68[0]);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] * 4 + 4);
    }
    std::__cxx11::wstring::substr((ulong)local_68,(ulong)local_48);
    std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,(ulong)local_68[0]);
    if (local_68[0] == local_58) goto LAB_0016bb4d;
  }
  else {
    if (iVar1 != 0x33) {
      if (iVar1 == 0x34) {
        std::__cxx11::wstring::substr((ulong)local_68,(ulong)local_48);
        std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,(ulong)local_68[0]);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] * 4 + 4);
        }
        local_68[0] = local_58;
        std::__cxx11::wstring::_M_construct((ulong)local_68,L'\x05');
        std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,(ulong)local_68[0]);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] * 4 + 4);
        }
      }
      else {
        std::__cxx11::wstring::substr((ulong)local_68,(ulong)local_48);
        std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,(ulong)local_68[0]);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] * 4 + 4);
        }
        local_68[0] = local_58;
        std::__cxx11::wstring::_M_construct((ulong)local_68,L'\x04');
        std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,(ulong)local_68[0]);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] * 4 + 4);
        }
      }
      std::__cxx11::wstring::push_back(wVar3);
      goto LAB_0016bb4d;
    }
    std::__cxx11::wstring::substr((ulong)local_68,(ulong)local_48);
    std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,(ulong)local_68[0]);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] * 4 + 4);
    }
    local_68[0] = local_58;
    std::__cxx11::wstring::_M_construct((ulong)local_68,L'\x05');
    std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,(ulong)local_68[0]);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] * 4 + 4);
    }
    std::__cxx11::wstring::substr((ulong)local_68,(ulong)local_48);
    std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,(ulong)local_68[0]);
    if (local_68[0] == local_58) goto LAB_0016bb4d;
  }
  operator_delete(local_68[0],local_58[0] * 4 + 4);
LAB_0016bb4d:
  if (7 < *(ulong *)(this + 8)) {
    std::__cxx11::wstring::push_back(wVar3);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

StringT ConvertUPCEtoUPCA(const StringT& upce)
{
	if (upce.length() < 7)
		return upce;

	auto upceChars = upce.substr(1, 6);

	StringT result;
	result.reserve(12);
	result += upce[0];
	auto lastChar = upceChars[5];
	switch (lastChar) {
	case '0':
	case '1':
	case '2':
		result += upceChars.substr(0, 2);
		result += lastChar;
		result += StringT(4, '0');
		result += upceChars.substr(2, 3);
		break;
	case '3':
		result += upceChars.substr(0, 3);
		result += StringT(5, '0');
		result += upceChars.substr(3, 2);
		break;
	case '4':
		result += upceChars.substr(0, 4);
		result += StringT(5, '0');
		;
		result += upceChars[4];
		break;
	default:
		result += upceChars.substr(0, 5);
		result += StringT(4, '0');
		result += lastChar;
		break;
	}
	// Only append check digit in conversion if supplied
	if (upce.length() >= 8) {
		result += upce[7];
	}
	return result;
}